

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

bool __thiscall
ON_ArchivableDictionaryPrivate::TryGetValue<ON_SimpleArray<signed_char>>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,ON_SimpleArray<signed_char> *value)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  DictionaryEntryT<ON_SimpleArray<signed_char>,_(DictionaryEntryType)15> *this_00;
  const_reference src;
  pointer entry;
  _Self local_30;
  const_iterator iterator;
  ON_SimpleArray<signed_char> *value_local;
  wchar_t *key_local;
  ON_ArchivableDictionaryPrivate *this_local;
  
  iterator._M_node = (_Base_ptr)value;
  value_local = (ON_SimpleArray<signed_char> *)key;
  key_local = (wchar_t *)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ON_wString,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
       ::find<wchar_t_const*>
                 ((map<ON_wString,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>,std::less<void>,std::allocator<std::pair<ON_wString_const,std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>>>>
                   *)&this->m_map,(wchar_t **)&value_local);
  entry = (pointer)std::
                   map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
                   ::end(&this->m_map);
  bVar1 = std::operator==(&local_30,(_Self *)&entry);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
             ::operator->(&local_30);
    this_00 = (DictionaryEntryT<ON_SimpleArray<signed_char>,_(DictionaryEntryType)15> *)
              std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::get
                        (&ppVar3->second);
    iVar2 = (*(this_00->super_DictionaryEntry)._vptr_DictionaryEntry[2])();
    if (iVar2 == 0xf) {
      src = DictionaryEntryT<ON_SimpleArray<signed_char>,_(DictionaryEntryType)15>::Value(this_00);
      ON_SimpleArray<signed_char>::operator=((ON_SimpleArray<signed_char> *)iterator._M_node,src);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TryGetValue(const wchar_t* key, T& value) const
  {
    const auto iterator = m_map.find(key);
    if (iterator == m_map.end()) return false;

    const auto entry = iterator->second.get();
    if (entry->EntryType() != Entry<T>::Type)
      return false;

    value = static_cast<const Entry<T>*>(entry)->Value();
    return true;
  }